

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classification.hpp
# Opt level: O3

void __thiscall
boost::algorithm::detail::is_any_ofF<char>::is_any_ofF<boost::iterator_range<char_const*>>
          (is_any_ofF<char> *this,iterator_range<const_char_*> *Range)

{
  long lVar1;
  long lVar2;
  is_any_ofF<char> *__dest;
  char *pcVar3;
  char *__src;
  size_t sVar4;
  
  (this->m_Storage).m_dynSet = (set_value_type *)0x0;
  __src = (Range->
          super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>).
          super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
          super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
          m_Begin;
  pcVar3 = (Range->
           super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>).
           super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
           super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
           m_End;
  sVar4 = (long)pcVar3 - (long)__src;
  this->m_Size = sVar4;
  __dest = this;
  if (0x10 < sVar4) {
    __dest = (is_any_ofF<char> *)operator_new__(sVar4);
    (this->m_Storage).m_dynSet = (set_value_type *)__dest;
    __src = (Range->
            super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>).
            super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>.
            super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>.
            m_Begin;
    pcVar3 = (Range->
             super_iterator_range_base<const_char_*,_boost::iterators::random_access_traversal_tag>)
             .super_iterator_range_base<const_char_*,_boost::iterators::bidirectional_traversal_tag>
             .super_iterator_range_base<const_char_*,_boost::iterators::incrementable_traversal_tag>
             .m_End;
  }
  if ((long)pcVar3 - (long)__src != 0) {
    memmove(__dest,__src,(long)pcVar3 - (long)__src);
    sVar4 = this->m_Size;
  }
  if (sVar4 != 0) {
    lVar1 = (long)&__dest->m_Storage + sVar4;
    lVar2 = 0x3f;
    if (sVar4 != 0) {
      for (; sVar4 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::__introsort_loop<char*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (__dest,lVar1,((uint)lVar2 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<char*,__gnu_cxx::__ops::_Iter_less_iter>(__dest,lVar1);
    return;
  }
  return;
}

Assistant:

is_any_ofF( const RangeT& Range ) : m_Size(0)
                {
                    // Prepare storage
                    m_Storage.m_dynSet=0;

                    std::size_t Size=::boost::distance(Range);
                    m_Size=Size;
                    set_value_type* Storage=0;

                    if(use_fixed_storage(m_Size))
                    {
                        // Use fixed storage
                        Storage=&m_Storage.m_fixSet[0];
                    }
                    else
                    {
                        // Use dynamic storage
                        m_Storage.m_dynSet=new set_value_type[m_Size];
                        Storage=m_Storage.m_dynSet;
                    }

                    // Use fixed storage
                    ::std::copy(::boost::begin(Range), ::boost::end(Range), Storage);
                    ::std::sort(Storage, Storage+m_Size);
                }